

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int rtrimCollFunc(void *pUser,int nKey1,void *pKey1,int nKey2,void *pKey2)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  uint uVar5;
  
  uVar5 = 0;
  if (nKey1 != 0) {
    lVar4 = (long)nKey1;
    do {
      if (*(char *)((long)pKey1 + lVar4 + -1) != ' ') {
        uVar5 = (uint)lVar4;
        break;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  if (nKey2 != 0) {
    lVar4 = (long)nKey2;
    do {
      if (*(char *)((long)pKey2 + lVar4 + -1) != ' ') {
        uVar2 = (uint)lVar4;
        uVar1 = uVar2;
        if ((int)uVar5 < (int)uVar2) {
          uVar1 = uVar5;
        }
        iVar3 = memcmp(pKey1,pKey2,(long)(int)uVar1);
        if (iVar3 == 0) {
          return uVar5 - uVar2;
        }
        return iVar3;
      }
      lVar4 = lVar4 + -1;
    } while (lVar4 != 0);
  }
  uVar1 = memcmp(pKey1,pKey2,(long)(int)((int)uVar5 >> 0x1f & uVar5));
  if (uVar1 == 0) {
    uVar1 = uVar5;
  }
  return uVar1;
}

Assistant:

static int rtrimCollFunc(
  void *pUser,
  int nKey1, const void *pKey1,
  int nKey2, const void *pKey2
){
  const u8 *pK1 = (const u8*)pKey1;
  const u8 *pK2 = (const u8*)pKey2;
  while( nKey1 && pK1[nKey1-1]==' ' ) nKey1--;
  while( nKey2 && pK2[nKey2-1]==' ' ) nKey2--;
  return binCollFunc(pUser, nKey1, pKey1, nKey2, pKey2);
}